

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_mont.c
# Opt level: O2

int BN_from_montgomery_word(BIGNUM *ret,BIGNUM *r,BN_MONT_CTX *mont)

{
  ulong *ap;
  int iVar1;
  ulong *bp;
  unsigned_long uVar2;
  ulong *rp;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  BIGNUM *pBVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  unsigned_long *rp_00;
  int iVar11;
  long lVar12;
  bool bVar13;
  
  iVar5 = (mont->N).top;
  lVar12 = (long)iVar5;
  if (lVar12 == 0) {
    ret->top = 0;
LAB_00112ac1:
    iVar5 = 1;
  }
  else {
    iVar11 = iVar5 * 2;
    pBVar6 = bn_wexpand(r,iVar11);
    if (pBVar6 != (BIGNUM *)0x0) {
      r->neg = r->neg ^ (mont->N).neg;
      bp = (mont->N).d;
      rp_00 = r->d;
      iVar1 = r->top;
      if (iVar11 != iVar1) {
        memset(rp_00 + iVar1,0,(long)(iVar11 - iVar1) << 3);
      }
      r->top = iVar11;
      uVar2 = mont->n0[0];
      uVar9 = 0;
      iVar11 = 0;
      if (0 < iVar5) {
        iVar11 = iVar5;
      }
      while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
        uVar7 = bn_mul_add_words(rp_00,bp,iVar5,*rp_00 * uVar2);
        uVar8 = uVar7 + uVar9 + rp_00[lVar12];
        uVar9 = (ulong)(((byte)uVar9 | uVar7 + uVar9 != 0) & uVar8 <= rp_00[lVar12]);
        rp_00[lVar12] = uVar8;
        rp_00 = rp_00 + 1;
      }
      pBVar6 = bn_wexpand(ret,iVar5);
      if (pBVar6 != (BIGNUM *)0x0) {
        ret->top = iVar5;
        ret->neg = r->neg;
        rp = ret->d;
        ap = r->d + lVar12;
        uVar8 = bn_sub_words(rp,ap,bp,iVar5);
        uVar9 = ((ulong)ap ^ (ulong)rp) & uVar9 - uVar8 ^ (ulong)rp;
        for (lVar10 = 0; lVar10 < lVar12 + -4; lVar10 = lVar10 + 4) {
          uVar8 = *(ulong *)(uVar9 + lVar10 * 8);
          uVar7 = *(ulong *)(uVar9 + 8 + lVar10 * 8);
          uVar3 = *(ulong *)(uVar9 + 0x10 + lVar10 * 8);
          ap[lVar10] = 0;
          uVar4 = *(ulong *)(uVar9 + 0x18 + lVar10 * 8);
          ap[lVar10 + 1] = 0;
          rp[lVar10] = uVar8;
          ap[lVar10 + 2] = 0;
          rp[lVar10 + 1] = uVar7;
          ap[lVar10 + 3] = 0;
          rp[lVar10 + 2] = uVar3;
          rp[lVar10 + 3] = uVar4;
        }
        for (; lVar10 < lVar12; lVar10 = lVar10 + 1) {
          rp[lVar10] = *(ulong *)(uVar9 + lVar10 * 8);
          ap[lVar10] = 0;
        }
        bn_correct_top(r);
        bn_correct_top(ret);
        goto LAB_00112ac1;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int BN_from_montgomery_word(BIGNUM *ret, BIGNUM *r, BN_MONT_CTX *mont)
{
    BIGNUM *n;
    BN_ULONG *ap, *np, *rp, n0, v, carry;
    int nl, max, i;

    n = &(mont->N);
    nl = n->top;
    if (nl == 0) {
        ret->top = 0;
        return (1);
    }

    max = (2 * nl);             /* carry is stored separately */
    if (bn_wexpand(r, max) == NULL)
        return (0);

    r->neg ^= n->neg;
    np = n->d;
    rp = r->d;

    /* clear the top words of T */
    i = max - r->top;
    if (i)
        memset(&rp[r->top], 0, sizeof(*rp) * i);

    r->top = max;
    n0 = mont->n0[0];

    for (carry = 0, i = 0; i < nl; i++, rp++) {
        v = bn_mul_add_words(rp, np, nl, (rp[0] * n0) & BN_MASK2);
        v = (v + carry + rp[nl]) & BN_MASK2;
        carry |= (v != rp[nl]);
        carry &= (v <= rp[nl]);
        rp[nl] = v;
    }

    if (bn_wexpand(ret, nl) == NULL)
        return (0);
    ret->top = nl;
    ret->neg = r->neg;

    rp = ret->d;
    ap = &(r->d[nl]);

# define BRANCH_FREE 1
# if BRANCH_FREE
    {
        BN_ULONG *nrp;
        size_t m;

        v = bn_sub_words(rp, ap, np, nl) - carry;
        /*
         * if subtraction result is real, then trick unconditional memcpy
         * below to perform in-place "refresh" instead of actual copy.
         */
        m = (0 - (size_t)v);
        nrp =
            (BN_ULONG *)(((PTR_SIZE_INT) rp & ~m) | ((PTR_SIZE_INT) ap & m));

        for (i = 0, nl -= 4; i < nl; i += 4) {
            BN_ULONG t1, t2, t3, t4;

            t1 = nrp[i + 0];
            t2 = nrp[i + 1];
            t3 = nrp[i + 2];
            ap[i + 0] = 0;
            t4 = nrp[i + 3];
            ap[i + 1] = 0;
            rp[i + 0] = t1;
            ap[i + 2] = 0;
            rp[i + 1] = t2;
            ap[i + 3] = 0;
            rp[i + 2] = t3;
            rp[i + 3] = t4;
        }
        for (nl += 4; i < nl; i++)
            rp[i] = nrp[i], ap[i] = 0;
    }
# else
    if (bn_sub_words(rp, ap, np, nl) - carry)
        memcpy(rp, ap, nl * sizeof(BN_ULONG));
# endif
    bn_correct_top(r);
    bn_correct_top(ret);
    bn_check_top(ret);

    return (1);
}